

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall AddrManImpl::Connected_(AddrManImpl *this,CService *addr,NodeSeconds time)

{
  long lVar1;
  AddrInfo *pAVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar2 = Find(this,addr,(nid_type *)0x0);
  if ((pAVar2 != (AddrInfo *)0x0) &&
     (0x4b0 < (long)time.__d.__r - (pAVar2->super_CAddress).nTime.__d.__r)) {
    (pAVar2->super_CAddress).nTime.__d.__r = (rep)time.__d.__r;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Connected_(const CService& addr, NodeSeconds time)
{
    AssertLockHeld(cs);

    AddrInfo* pinfo = Find(addr);

    // if not found, bail out
    if (!pinfo)
        return;

    AddrInfo& info = *pinfo;

    // update info
    const auto update_interval{20min};
    if (time - info.nTime > update_interval) {
        info.nTime = time;
    }
}